

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O0

Flow * __thiscall
wasm::ModuleRunnerBase<wasm::ModuleRunner>::visitMemoryInit
          (Flow *__return_storage_ptr__,ModuleRunnerBase<wasm::ModuleRunner> *this,MemoryInit *curr)

{
  ExternalInterface *pEVar1;
  Name memory;
  Type TVar2;
  undefined1 this_00 [8];
  bool bVar3;
  uint uVar4;
  ExpressionRunner<wasm::ModuleRunner> *pEVar5;
  long lVar6;
  uint64_t a;
  Literal *pLVar7;
  address64_t aVar8;
  address64_t aVar9;
  size_type sVar10;
  size_type sVar11;
  address64_t aVar12;
  reference pvVar13;
  Name NVar14;
  Literal local_1c8;
  address64_t local_1b0;
  undefined1 local_1a8 [8];
  Literal addr;
  size_t i;
  Address local_170;
  Address memorySize;
  undefined1 local_158 [8];
  MemoryInstanceInfo info;
  Address sizeVal;
  Address offsetVal;
  Address destVal;
  DataSegment *segment;
  Flow size;
  Flow offset;
  undefined1 local_68 [8];
  Flow dest;
  MemoryInit *curr_local;
  ModuleRunnerBase<wasm::ModuleRunner> *this_local;
  
  dest.breakTo.super_IString.str._M_str = (char *)curr;
  pEVar5 = (ExpressionRunner<wasm::ModuleRunner> *)self(this);
  ExpressionRunner<wasm::ModuleRunner>::visit
            ((Flow *)local_68,pEVar5,*(Expression **)(dest.breakTo.super_IString.str._M_str + 0x20))
  ;
  bVar3 = Flow::breaking((Flow *)local_68);
  if (bVar3) {
    Flow::Flow(__return_storage_ptr__,(Flow *)local_68);
  }
  else {
    pEVar5 = (ExpressionRunner<wasm::ModuleRunner> *)self(this);
    ExpressionRunner<wasm::ModuleRunner>::visit
              ((Flow *)&size.breakTo.super_IString.str._M_str,pEVar5,
               *(Expression **)(dest.breakTo.super_IString.str._M_str + 0x28));
    bVar3 = Flow::breaking((Flow *)&size.breakTo.super_IString.str._M_str);
    if (bVar3) {
      Flow::Flow(__return_storage_ptr__,(Flow *)&size.breakTo.super_IString.str._M_str);
    }
    else {
      pEVar5 = (ExpressionRunner<wasm::ModuleRunner> *)self(this);
      ExpressionRunner<wasm::ModuleRunner>::visit
                ((Flow *)&segment,pEVar5,
                 *(Expression **)(dest.breakTo.super_IString.str._M_str + 0x30));
      bVar3 = Flow::breaking((Flow *)&segment);
      if (bVar3) {
        Flow::Flow(__return_storage_ptr__,(Flow *)&segment);
      }
      else {
        NVar14.super_IString.str._M_str = *(char **)(dest.breakTo.super_IString.str._M_str + 0x10);
        NVar14.super_IString.str._M_len = (size_t)this->wasm;
        lVar6 = ::wasm::Module::getDataSegment(NVar14);
        Flow::getSingleValue((Flow *)local_68);
        a = ::wasm::Literal::getUnsigned();
        Address::Address(&offsetVal,a);
        pLVar7 = Flow::getSingleValue((Flow *)&size.breakTo.super_IString.str._M_str);
        uVar4 = wasm::Literal::geti32(pLVar7);
        Address::Address(&sizeVal,(ulong)uVar4);
        pLVar7 = Flow::getSingleValue((Flow *)&segment);
        uVar4 = wasm::Literal::geti32(pLVar7);
        Address::Address((Address *)&info.name.super_IString.str._M_str,(ulong)uVar4);
        aVar8 = Address::operator_cast_to_unsigned_long(&sizeVal);
        aVar9 = Address::operator_cast_to_unsigned_long
                          ((Address *)&info.name.super_IString.str._M_str);
        if (aVar8 + aVar9 != 0) {
          sVar10 = std::
                   unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
                   ::count(&this->droppedSegments,
                           (key_type *)(dest.breakTo.super_IString.str._M_str + 0x10));
          if (sVar10 != 0) {
            (*(this->super_ExpressionRunner<wasm::ModuleRunner>)._vptr_ExpressionRunner[2])
                      (this,"out of bounds segment access in memory.init");
          }
        }
        aVar8 = Address::operator_cast_to_unsigned_long(&sizeVal);
        aVar9 = Address::operator_cast_to_unsigned_long
                          ((Address *)&info.name.super_IString.str._M_str);
        sVar11 = std::vector<char,_std::allocator<char>_>::size
                           ((vector<char,_std::allocator<char>_> *)(lVar6 + 0x38));
        if (sVar11 < aVar8 + aVar9) {
          (*(this->super_ExpressionRunner<wasm::ModuleRunner>)._vptr_ExpressionRunner[2])
                    (this,"out of bounds segment access in memory.init");
        }
        memorySize.addr = (((IString *)(dest.breakTo.super_IString.str._M_str + 0x38))->str)._M_len;
        getMemoryInstanceInfo
                  ((MemoryInstanceInfo *)local_158,this,
                   (Name)((IString *)(dest.breakTo.super_IString.str._M_str + 0x38))->str);
        memory.super_IString.str._M_len._4_4_ = info.instance._4_4_;
        memory.super_IString.str._M_len._0_4_ = info.instance._0_4_;
        memory.super_IString.str._M_str._4_4_ = info.name.super_IString.str._M_len._4_4_;
        memory.super_IString.str._M_str._0_4_ = (undefined4)info.name.super_IString.str._M_len;
        local_170 = getMemorySize((ModuleRunnerBase<wasm::ModuleRunner> *)local_158,memory);
        aVar8 = Address::operator_cast_to_unsigned_long(&offsetVal);
        aVar9 = Address::operator_cast_to_unsigned_long
                          ((Address *)&info.name.super_IString.str._M_str);
        aVar12 = Address::operator_cast_to_unsigned_long(&local_170);
        if (aVar12 << 0x10 < aVar8 + aVar9) {
          (*(this->super_ExpressionRunner<wasm::ModuleRunner>)._vptr_ExpressionRunner[2])
                    (this,"out of bounds memory access in memory.init");
        }
        addr.type.id = 0;
        while( true ) {
          TVar2.id = addr.type.id;
          aVar8 = Address::operator_cast_to_unsigned_long
                            ((Address *)&info.name.super_IString.str._M_str);
          if (aVar8 <= TVar2.id) break;
          aVar8 = Address::operator_cast_to_unsigned_long(&offsetVal);
          wasm::Literal::Literal((Literal *)local_1a8,aVar8 + addr.type.id);
          this_00 = local_158;
          pEVar1 = *(ExternalInterface **)((long)local_158 + 0x288);
          ::wasm::Literal::Literal(&local_1c8,(Literal *)local_1a8);
          local_1b0 = (address64_t)
                      getFinalAddressWithoutOffset
                                ((ModuleRunnerBase<wasm::ModuleRunner> *)this_00,&local_1c8,1,
                                 local_170);
          aVar8 = Address::operator_cast_to_unsigned_long(&sizeVal);
          pvVar13 = std::vector<char,_std::allocator<char>_>::operator[]
                              ((vector<char,_std::allocator<char>_> *)(lVar6 + 0x38),
                               aVar8 + addr.type.id);
          (*pEVar1->_vptr_ExternalInterface[0x16])
                    (pEVar1,local_1b0,(ulong)(uint)(int)*pvVar13,
                     CONCAT44(info.instance._4_4_,info.instance._0_4_),
                     CONCAT44(info.name.super_IString.str._M_len._4_4_,
                              (undefined4)info.name.super_IString.str._M_len));
          ::wasm::Literal::~Literal(&local_1c8);
          ::wasm::Literal::~Literal((Literal *)local_1a8);
          addr.type.id = addr.type.id + 1;
        }
        Flow::Flow(__return_storage_ptr__);
      }
      Flow::~Flow((Flow *)&segment);
    }
    Flow::~Flow((Flow *)&size.breakTo.super_IString.str._M_str);
  }
  Flow::~Flow((Flow *)local_68);
  return __return_storage_ptr__;
}

Assistant:

Flow visitMemoryInit(MemoryInit* curr) {
    NOTE_ENTER("MemoryInit");
    Flow dest = self()->visit(curr->dest);
    if (dest.breaking()) {
      return dest;
    }
    Flow offset = self()->visit(curr->offset);
    if (offset.breaking()) {
      return offset;
    }
    Flow size = self()->visit(curr->size);
    if (size.breaking()) {
      return size;
    }
    NOTE_EVAL1(dest);
    NOTE_EVAL1(offset);
    NOTE_EVAL1(size);

    auto* segment = wasm.getDataSegment(curr->segment);

    Address destVal(dest.getSingleValue().getUnsigned());
    Address offsetVal(uint32_t(offset.getSingleValue().geti32()));
    Address sizeVal(uint32_t(size.getSingleValue().geti32()));

    if (offsetVal + sizeVal > 0 && droppedSegments.count(curr->segment)) {
      trap("out of bounds segment access in memory.init");
    }
    if ((uint64_t)offsetVal + sizeVal > segment->data.size()) {
      trap("out of bounds segment access in memory.init");
    }
    auto info = getMemoryInstanceInfo(curr->memory);
    auto memorySize = info.instance->getMemorySize(info.name);
    if (destVal + sizeVal > memorySize * Memory::kPageSize) {
      trap("out of bounds memory access in memory.init");
    }
    for (size_t i = 0; i < sizeVal; ++i) {
      Literal addr(destVal + i);
      info.instance->externalInterface->store8(
        info.instance->getFinalAddressWithoutOffset(addr, 1, memorySize),
        segment->data[offsetVal + i],
        info.name);
    }
    return {};
  }